

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O2

void (anonymous_namespace)::permutations<Imath_2_5::Vec2<float>>
               (vector<Imath_2_5::Vec2<float>,_std::allocator<Imath_2_5::Vec2<float>_>_> *perms)

{
  int level;
  vector<int,_std::allocator<int>_> value;
  
  std::vector<int,_std::allocator<int>_>::vector(&value,2,(allocator_type *)&level);
  level = -1;
  visit<Imath_2_5::Vec2<float>>(&level,2,0,&value,perms);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&value.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

static void
permutations(std::vector<T> &perms)
{
    std::vector<int> value(T::dimensions());
    int level = -1;
    int n     = T::dimensions();

    visit(level, n, 0, value, perms);
}